

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::bootstrap::ptr_assign<chaiscript::dispatch::Proxy_Function_Base>
          (bootstrap *this,Boxed_Value *lhs,
          shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *rhs)

{
  uint uVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  undefined8 *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar6;
  Boxed_Value BStack_48;
  Type_Info local_38;
  
  peVar2 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 1) == 0) {
      local_38.m_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
      local_38.m_bare_type_info = (type_info *)&dispatch::Proxy_Function_Base::typeinfo;
      local_38.m_flags = 0;
      bVar4 = Type_Info::bare_equal(&peVar2->m_type_info,&local_38);
      if (bVar4) goto LAB_003622c1;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x38);
    *puVar5 = &PTR__bad_cast_00478b08;
    puVar5[1] = &Type_Info::Unknown_Type::typeinfo;
    puVar5[2] = &Type_Info::Unknown_Type::typeinfo;
    *(undefined4 *)(puVar5 + 3) = 0x20;
    puVar5[4] = 0;
    puVar5[5] = 0x23;
    puVar5[6] = "type mismatch in pointer assignment";
    __cxa_throw(puVar5,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
  }
LAB_003622c1:
  Boxed_Value::Object_Data::get<chaiscript::dispatch::Proxy_Function_Base>
            ((Object_Data *)&local_38,rhs,false);
  Boxed_Value::assign(&BStack_48,lhs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&BStack_48.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.m_bare_type_info);
  peVar2 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
  (lhs->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar6.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value ptr_assign(Boxed_Value lhs, const std::shared_ptr<Type> &rhs) {
    if (lhs.is_undef() || (!lhs.get_type_info().is_const() && lhs.get_type_info().bare_equal(chaiscript::detail::Get_Type_Info<Type>::get()))) {
      lhs.assign(Boxed_Value(rhs));
      return lhs;
    } else {
      throw exception::bad_boxed_cast("type mismatch in pointer assignment");
    }
  }